

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O3

Aig_Man_t *
Aig_ManRegCreatePart
          (Aig_Man_t *pAig,Vec_Int_t *vPart,int *pnCountPis,int *pnCountRegs,int **ppMapBack)

{
  int iVar1;
  void **ppvVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  uint *__ptr;
  Aig_Obj_t **ppNodes;
  void *pvVar6;
  Vec_Ptr_t *__ptr_00;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  Aig_Obj_t *p1;
  ulong uVar12;
  size_t __size;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  uVar4 = vPart->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar4 - 1) {
    uVar12 = (ulong)uVar4;
  }
  __ptr[1] = 0;
  uVar5 = (uint)uVar12;
  *__ptr = uVar5;
  lVar13 = 0;
  if (uVar5 == 0) {
    ppNodes = (Aig_Obj_t **)0x0;
  }
  else {
    ppNodes = (Aig_Obj_t **)malloc((long)(int)uVar5 << 3);
  }
  *(Aig_Obj_t ***)(__ptr + 2) = ppNodes;
  if (0 < (int)uVar4) {
    iVar10 = pAig->nObjs[3];
    iVar1 = pAig->nRegs;
    lVar17 = 0;
    do {
      uVar4 = vPart->pArray[lVar17] + (iVar10 - iVar1);
      if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) goto LAB_006d055f;
      uVar16 = *(ulong *)((long)pAig->vCos->pArray[uVar4] + 8);
      iVar11 = (int)uVar12;
      if ((int)lVar17 == iVar11) {
        if (iVar11 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc(0x80);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar6;
          *__ptr = 0x10;
          uVar12 = 0x10;
        }
        else {
          uVar12 = (ulong)(uint)(iVar11 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc(uVar12 * 8);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),uVar12 * 8);
          }
          *(void **)(__ptr + 2) = pvVar6;
          *__ptr = iVar11 * 2;
        }
      }
      else {
        pvVar6 = *(void **)(__ptr + 2);
      }
      lVar13 = lVar17 + 1;
      __ptr[1] = (uint)lVar13;
      *(ulong *)((long)pvVar6 + lVar17 * 8) = uVar16 & 0xfffffffffffffffe;
      lVar17 = lVar13;
    } while (lVar13 < vPart->nSize);
    ppNodes = *(Aig_Obj_t ***)(__ptr + 2);
  }
  __ptr_00 = Aig_ManDfsNodes(pAig,ppNodes,(int)lVar13);
  if (ppNodes != (Aig_Obj_t **)0x0) {
    free(ppNodes);
  }
  free(__ptr);
  uVar4 = pAig->nRegs;
  iVar1 = pAig->nObjs[2];
  uVar5 = iVar1 - uVar4;
  iVar10 = vPart->nSize;
  if (0 < (long)iVar10) {
    piVar9 = vPart->pArray;
    pVVar8 = pAig->vCis;
    lVar13 = 0;
    do {
      uVar14 = piVar9[lVar13] + uVar5;
      if (((int)uVar14 < 0) || (pVVar8->nSize <= (int)uVar14)) goto LAB_006d055f;
      *(int *)((long)pVVar8->pArray[uVar14] + 0x20) = pAig->nTravIds + -1;
      lVar13 = lVar13 + 1;
    } while (iVar10 != lVar13);
    iVar1 = pAig->nObjs[2];
    uVar5 = iVar1 - uVar4;
  }
  iVar10 = 0;
  pVVar8 = pAig->vCis;
  uVar14 = pVVar8->nSize;
  uVar12 = (ulong)uVar5;
  iVar11 = 0;
  if (0 < (int)uVar5) {
    iVar11 = 0;
    uVar15 = 0;
    if (0 < (int)uVar14) {
      uVar15 = uVar14;
    }
    if (uVar15 <= iVar1 + ~uVar4) {
LAB_006d055f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar16 = 0;
    do {
      iVar11 = iVar11 + (uint)(*(int *)((long)pVVar8->pArray[uVar16] + 0x20) == pAig->nTravIds);
      uVar16 = uVar16 + 1;
    } while (uVar12 != uVar16);
  }
  if ((int)uVar5 < (int)uVar14) {
    iVar10 = 0;
    do {
      if ((int)uVar5 < 0) goto LAB_006d055f;
      iVar10 = iVar10 + (uint)(*(int *)((long)pVVar8->pArray[uVar12] + 0x20) == pAig->nTravIds);
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < (int)uVar14);
  }
  if (pnCountPis != (int *)0x0) {
    *pnCountPis = iVar11;
  }
  if (pnCountRegs != (int *)0x0) {
    *pnCountRegs = iVar10;
  }
  p = Aig_ManStart(__ptr_00->nSize);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar8 = pAig->vCis;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      pvVar6 = pVVar8->pArray[lVar13];
      if (*(int *)((long)pvVar6 + 0x20) == pAig->nTravIds) {
        pAVar7 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar7;
        pVVar8 = pAig->vCis;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar8->nSize);
  }
  uVar4 = vPart->nSize;
  if (0 < (int)uVar4) {
    iVar10 = pAig->nObjs[2];
    iVar1 = pAig->nRegs;
    lVar13 = 0;
    do {
      uVar4 = vPart->pArray[lVar13] + (iVar10 - iVar1);
      if (((int)uVar4 < 0) || (pAig->vCis->nSize <= (int)uVar4)) goto LAB_006d055f;
      pvVar6 = pAig->vCis->pArray[uVar4];
      pAVar7 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar7;
      Aig_ObjCreateCo(p,pAVar7);
      *(int *)((long)pvVar6 + 0x20) = pAig->nTravIds;
      lVar13 = lVar13 + 1;
      uVar4 = vPart->nSize;
    } while (lVar13 < (int)uVar4);
  }
  iVar10 = __ptr_00->nSize;
  if (0 < iVar10) {
    lVar13 = 0;
    do {
      pvVar6 = __ptr_00->pArray[lVar13];
      if (0xfffffffd < (*(uint *)((long)pvVar6 + 0x18) & 7) - 7) {
        if (((ulong)pvVar6 & 1) != 0) goto LAB_006d057e;
        uVar12 = *(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe;
        if (uVar12 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar6 + 8) & 1) ^ *(ulong *)(uVar12 + 0x28));
        }
        uVar12 = *(ulong *)((long)pvVar6 + 0x10) & 0xfffffffffffffffe;
        if (uVar12 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar6 + 0x10) & 1) ^ *(ulong *)(uVar12 + 0x28));
        }
        pAVar7 = Aig_And(p,pAVar7,p1);
        *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar7;
        iVar10 = __ptr_00->nSize;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar10);
    uVar4 = vPart->nSize;
  }
  if (0 < (int)uVar4) {
    iVar10 = pAig->nObjs[3];
    iVar1 = pAig->nRegs;
    lVar13 = 0;
    do {
      uVar4 = vPart->pArray[lVar13] + (iVar10 - iVar1);
      if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) goto LAB_006d055f;
      pvVar6 = pAig->vCos->pArray[uVar4];
      if (((ulong)pvVar6 & 1) != 0) {
LAB_006d057e:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar12 = *(ulong *)((long)pvVar6 + 8);
      uVar16 = uVar12 & 0xfffffffffffffffe;
      if (uVar16 == 0) {
        pAVar7 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar12 & 1) ^ *(ulong *)(uVar16 + 0x28));
      }
      Aig_ObjCreateCo(p,pAVar7);
      lVar13 = lVar13 + 1;
      uVar4 = vPart->nSize;
    } while (lVar13 < (int)uVar4);
  }
  p->nRegs = uVar4;
  if (ppMapBack != (int **)0x0) {
    __size = (long)p->vObjs->nSize << 2;
    piVar9 = (int *)malloc(__size);
    memset(piVar9,0xff,__size);
    *piVar9 = 0;
    iVar10 = __ptr_00->nSize;
    if (0 < (long)iVar10) {
      ppvVar2 = __ptr_00->pArray;
      uVar12 = 0;
      do {
        piVar9[*(int *)((*(ulong *)((long)ppvVar2[uVar12] + 0x28) & 0xfffffffffffffffe) + 0x24)] =
             *(int *)((long)ppvVar2[uVar12] + 0x24);
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)(long)iVar10);
    }
    if (0 < (int)uVar4) {
      iVar10 = pAig->nObjs[2];
      iVar1 = pAig->nRegs;
      piVar3 = vPart->pArray;
      pVVar8 = pAig->vCis;
      uVar12 = 0;
      do {
        uVar5 = piVar3[uVar12] + (iVar10 - iVar1);
        if (((int)uVar5 < 0) || (pVVar8->nSize <= (int)uVar5)) goto LAB_006d055f;
        pvVar6 = pVVar8->pArray[uVar5];
        piVar9[*(int *)(*(long *)((long)pvVar6 + 0x28) + 0x24)] = *(int *)((long)pvVar6 + 0x24);
        uVar12 = uVar12 + 1;
      } while (uVar4 != uVar12);
    }
    *ppMapBack = piVar9;
  }
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  return p;
}

Assistant:

Aig_Man_t * Aig_ManRegCreatePart( Aig_Man_t * pAig, Vec_Int_t * vPart, int * pnCountPis, int * pnCountRegs, int ** ppMapBack )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    Vec_Ptr_t * vNodes;
    Vec_Ptr_t * vRoots;
    int nOffset, iOut, i;
    int nCountPis, nCountRegs;
    int * pMapBack;
    // collect roots
    vRoots = Vec_PtrAlloc( Vec_IntSize(vPart) );
    nOffset = Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCo(pAig, nOffset+iOut);
        Vec_PtrPush( vRoots, Aig_ObjFanin0(pObj) );
    }
    // collect/mark nodes/PIs in the DFS order
    vNodes = Aig_ManDfsNodes( pAig, (Aig_Obj_t **)Vec_PtrArray(vRoots), Vec_PtrSize(vRoots) );
    Vec_PtrFree( vRoots );
    // unmark register outputs
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCi(pAig, nOffset+iOut);
        Aig_ObjSetTravIdPrevious( pAig, pObj );
    }
    // count pure PIs
    nCountPis = nCountRegs = 0;
    Aig_ManForEachPiSeq( pAig, pObj, i )
        nCountPis += Aig_ObjIsTravIdCurrent(pAig, pObj);
    // count outputs of other registers
    Aig_ManForEachLoSeq( pAig, pObj, i )
        nCountRegs += Aig_ObjIsTravIdCurrent(pAig, pObj); 
    if ( pnCountPis )
        *pnCountPis = nCountPis;
    if ( pnCountRegs )
        *pnCountRegs = nCountRegs;
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    Aig_ManConst1(pAig)->pData = Aig_ManConst1(pNew);
    // create the PIs
    Aig_ManForEachCi( pAig, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
    // add variables for the register outputs
    // create fake POs to hold the register outputs
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCi(pAig, nOffset+iOut);
        pObj->pData = Aig_ObjCreateCi(pNew);
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
        Aig_ObjSetTravIdCurrent( pAig, pObj ); // added
    }
    // create the nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And(pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add real POs for the registers
    nOffset = Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCo( pAig, nOffset+iOut );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    pNew->nRegs = Vec_IntSize(vPart);
    // create map
    if ( ppMapBack )
    {
        pMapBack = ABC_ALLOC( int, Aig_ManObjNumMax(pNew) );
        memset( pMapBack, 0xff, sizeof(int) * Aig_ManObjNumMax(pNew) );
        // map constant nodes
        pMapBack[0] = 0;
        // logic cones of register outputs
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        {
            pObjNew = Aig_Regular((Aig_Obj_t *)pObj->pData);
            pMapBack[pObjNew->Id] = pObj->Id;
        }
        // map register outputs
        nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
        Vec_IntForEachEntry( vPart, iOut, i )
        {
            pObj = Aig_ManCi(pAig, nOffset+iOut);
            pObjNew = (Aig_Obj_t *)pObj->pData;
            pMapBack[pObjNew->Id] = pObj->Id;
        }
        *ppMapBack = pMapBack;
    }
    Vec_PtrFree( vNodes );
    return pNew;
}